

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O3

char * Scl_LibertyReadString(Scl_Tree_t *p,Scl_Pair_t Pair)

{
  int iVar1;
  size_t __n;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  
  iVar4 = Pair.Beg;
  iVar1 = Pair.End - iVar4;
  if (4999 < iVar1) {
    __assert_fail("Pair.End-Pair.Beg < ABC_MAX_LIB_STR_LEN",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                  ,0x158,"char *Scl_LibertyReadString(Scl_Tree_t *, Scl_Pair_t)");
  }
  __n = (size_t)iVar1;
  pcVar3 = Scl_LibertyReadString::Buffer;
  strncpy(Scl_LibertyReadString::Buffer,p->pContents + iVar4,__n);
  if ((iVar4 < Pair.End) && (Scl_LibertyReadString::Buffer[0] == '\"')) {
    if (*(char *)((long)&Abc_SclDumpStats_clk + __n + 7) != '\"') {
      __assert_fail("Buffer[Pair.End-Pair.Beg-1] == \'\\\"\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                    ,0x15c,"char *Scl_LibertyReadString(Scl_Tree_t *, Scl_Pair_t)");
    }
    pcVar2 = (char *)((long)&Abc_SclDumpStats_clk + __n + 7);
    pcVar3 = Scl_LibertyReadString::Buffer + 1;
  }
  else {
    pcVar2 = Scl_LibertyReadString::Buffer + __n;
  }
  *pcVar2 = '\0';
  return pcVar3;
}

Assistant:

char * Scl_LibertyReadString( Scl_Tree_t * p, Scl_Pair_t Pair )   
{ 
    static char Buffer[ABC_MAX_LIB_STR_LEN]; 
    assert( Pair.End-Pair.Beg < ABC_MAX_LIB_STR_LEN );
    strncpy( Buffer, p->pContents+Pair.Beg, Pair.End-Pair.Beg ); 
    if ( Pair.Beg < Pair.End && Buffer[0] == '\"' )
    {
        assert( Buffer[Pair.End-Pair.Beg-1] == '\"' );
        Buffer[Pair.End-Pair.Beg-1] = 0;
        return Buffer + 1;
    }
    Buffer[Pair.End-Pair.Beg] = 0;
    return Buffer;
}